

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomInclude::write(DomInclude *this,int __fd,void *__buf,size_t __n)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QString local_40;
  long local_28;
  
  aVar3._4_4_ = in_register_00000034;
  aVar3._0_4_ = __fd;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"include";
    local_40.d.size = 7;
  }
  else {
    QString::toLower_helper(&local_40);
  }
  QVar4.m_size = (size_t)local_40.d.ptr;
  QVar4.field_0.m_data = aVar3.m_data;
  QXmlStreamWriter::writeStartElement(QVar4);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (this->m_has_attr_location == true) {
    pQVar1 = &((this->m_attr_location).d.d)->super_QArrayData;
    pcVar2 = (this->m_attr_location).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar6.m_size = (size_t)L"location";
      QVar6.field_0.m_data = aVar3.m_data;
      QVar11.m_size = (size_t)pcVar2;
      QVar11.field_0.m_data = (void *)0x8000000000000008;
      QXmlStreamWriter::writeAttribute(QVar6,QVar11);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar5.m_size = (size_t)L"location";
      QVar5.field_0.m_data = aVar3.m_data;
      QVar10.m_size = (size_t)pcVar2;
      QVar10.field_0.m_data = (void *)0x8000000000000008;
      QXmlStreamWriter::writeAttribute(QVar5,QVar10);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_impldecl == true) {
    pQVar1 = &((this->m_attr_impldecl).d.d)->super_QArrayData;
    pcVar2 = (this->m_attr_impldecl).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar8.m_size = (size_t)L"impldecl";
      QVar8.field_0.m_data = aVar3.m_data;
      QVar13.m_size = (size_t)pcVar2;
      QVar13.field_0.m_data = (void *)0x8000000000000008;
      QXmlStreamWriter::writeAttribute(QVar8,QVar13);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar7.m_size = (size_t)L"impldecl";
      QVar7.field_0.m_data = aVar3.m_data;
      QVar12.m_size = (size_t)pcVar2;
      QVar12.field_0.m_data = (void *)0x8000000000000008;
      QXmlStreamWriter::writeAttribute(QVar7,QVar12);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if ((this->m_text).d.size != 0) {
    QVar9.m_size = (size_t)(this->m_text).d.ptr;
    QVar9.field_0.m_data = aVar3.m_data;
    QXmlStreamWriter::writeCharacters(QVar9);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomInclude::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("include") : tagName.toLower());

    if (hasAttributeLocation())
        writer.writeAttribute(u"location"_s, attributeLocation());

    if (hasAttributeImpldecl())
        writer.writeAttribute(u"impldecl"_s, attributeImpldecl());

    if (!m_text.isEmpty())
        writer.writeCharacters(m_text);

    writer.writeEndElement();
}